

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O0

FFsOptions * __thiscall
level_info_t::GetOptData<FFsOptions>(level_info_t *this,FName *id,bool create)

{
  level_info_t *this_00;
  FOptionalMapinfoDataPtr *pFVar1;
  FName local_50 [4];
  level_info_t *local_40;
  FFsOptions *newobj;
  FOptionalMapinfoDataPtr *local_30;
  FOptionalMapinfoDataPtr *pdat;
  FName *pFStack_20;
  bool create_local;
  FName *id_local;
  level_info_t *this_local;
  
  pdat._7_1_ = create;
  pFStack_20 = id;
  id_local = (FName *)this;
  FName::FName((FName *)((long)&newobj + 4),id);
  local_30 = TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
             ::CheckKey(&this->optdata,(FName *)((long)&newobj + 4));
  if (local_30 == (FOptionalMapinfoDataPtr *)0x0) {
    if ((pdat._7_1_ & 1) == 0) {
      this_local = (level_info_t *)0x0;
    }
    else {
      this_00 = (level_info_t *)operator_new(0x18);
      FFsOptions::FFsOptions((FFsOptions *)this_00);
      local_40 = this_00;
      FName::FName(local_50,id);
      pFVar1 = TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
               ::operator[](&this->optdata,local_50);
      pFVar1->Ptr = (FOptionalMapinfoData *)this_00;
      this_local = local_40;
    }
  }
  else {
    this_local = (level_info_t *)local_30->Ptr;
  }
  return (FFsOptions *)this_local;
}

Assistant:

T *GetOptData(FName id, bool create = true)
	{
		FOptionalMapinfoDataPtr *pdat = optdata.CheckKey(id);
		
		if (pdat != NULL)
		{
			return static_cast<T*>(pdat->Ptr);
		}
		else if (create)
		{
			T *newobj = new T;
			optdata[id].Ptr = newobj;
			return newobj;
		}
		else return NULL;
	}